

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_ringbuffer.h
# Opt level: O0

int __thiscall
ring_buffer_base<cubeb_log_message>::dequeue
          (ring_buffer_base<cubeb_log_message> *this,cubeb_log_message *elements,int count)

{
  bool bVar1;
  atomic<int> *paVar2;
  int *piVar3;
  cubeb_log_message *in_RSI;
  ring_buffer_base<cubeb_log_message> *in_RDI;
  int second_part;
  int first_part;
  int to_read;
  int wr_idx;
  int rd_idx;
  memory_order __b_1;
  memory_order __b;
  memory_order __b_2;
  int in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  ring_buffer_base<cubeb_log_message> *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  __int_type_conflict1 local_60;
  int local_5c;
  cubeb_log_message *local_58;
  int local_48;
  int local_44;
  memory_order local_40;
  int local_3c;
  atomic<int> *local_38;
  __int_type_conflict1 local_2c;
  memory_order local_28;
  int local_24;
  int local_10;
  int local_c;
  
  local_24 = 0;
  local_58 = in_RSI;
  local_28 = std::operator&(memory_order_relaxed,__memory_order_mask);
  if (local_24 - 1U < 2) {
    local_2c = (in_RDI->read_index_).super___atomic_base<int>._M_i;
  }
  else if (local_24 == 5) {
    local_2c = (in_RDI->read_index_).super___atomic_base<int>._M_i;
  }
  else {
    local_2c = (in_RDI->read_index_).super___atomic_base<int>._M_i;
  }
  local_60 = local_2c;
  paVar2 = &in_RDI->write_index_;
  local_3c = 2;
  local_38 = paVar2;
  local_40 = std::operator&(memory_order_acquire,__memory_order_mask);
  if (local_3c - 1U < 2) {
    local_44 = (paVar2->super___atomic_base<int>)._M_i;
  }
  else if (local_3c == 5) {
    local_44 = (paVar2->super___atomic_base<int>)._M_i;
  }
  else {
    local_44 = (paVar2->super___atomic_base<int>)._M_i;
  }
  local_64 = local_44;
  bVar1 = empty_internal(in_RDI,local_60,local_44);
  if (bVar1) {
    local_48 = 0;
  }
  else {
    local_6c = available_read_internal
                         ((ring_buffer_base<cubeb_log_message> *)
                          CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                          (int)((ulong)in_stack_ffffffffffffff40 >> 0x20),
                          (int)in_stack_ffffffffffffff40);
    piVar3 = std::min<int>(&local_6c,&local_5c);
    local_68 = *piVar3;
    local_74 = storage_capacity(in_RDI);
    local_74 = local_74 - local_60;
    piVar3 = std::min<int>(&local_74,&local_68);
    local_70 = *piVar3;
    if (local_58 != (cubeb_log_message *)0x0) {
      std::unique_ptr<cubeb_log_message[],_std::default_delete<cubeb_log_message[]>_>::get
                ((unique_ptr<cubeb_log_message[],_std::default_delete<cubeb_log_message[]>_> *)
                 0x11378e);
      Copy<cubeb_log_message>
                (local_58,(cubeb_log_message *)
                          CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                 (size_t)in_stack_ffffffffffffff40);
      std::unique_ptr<cubeb_log_message[],_std::default_delete<cubeb_log_message[]>_>::get
                ((unique_ptr<cubeb_log_message[],_std::default_delete<cubeb_log_message[]>_> *)
                 0x1137d0);
      Copy<cubeb_log_message>
                (local_58,(cubeb_log_message *)
                          CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                 (size_t)in_stack_ffffffffffffff40);
    }
    local_c = increment_index(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,
                              in_stack_ffffffffffffff38);
    local_10 = 3;
    std::operator&(memory_order_release,__memory_order_mask);
    if (local_10 == 3) {
      (in_RDI->read_index_).super___atomic_base<int>._M_i = local_c;
    }
    else if (local_10 == 5) {
      LOCK();
      (in_RDI->read_index_).super___atomic_base<int>._M_i = local_c;
      UNLOCK();
    }
    else {
      (in_RDI->read_index_).super___atomic_base<int>._M_i = local_c;
    }
    local_48 = local_68;
  }
  return local_48;
}

Assistant:

int dequeue(T * elements, int count)
  {
#ifndef NDEBUG
    assert_correct_thread(consumer_id);
#endif

    int rd_idx = read_index_.load(std::memory_order_relaxed);
    int wr_idx = write_index_.load(std::memory_order_acquire);

    if (empty_internal(rd_idx, wr_idx)) {
      return 0;
    }

    int to_read = std::min(available_read_internal(rd_idx, wr_idx), count);

    int first_part = std::min(storage_capacity() - rd_idx, to_read);
    int second_part = to_read - first_part;

    if (elements) {
      Copy(elements, data_.get() + rd_idx, first_part);
      Copy(elements + first_part, data_.get(), second_part);
    }

    read_index_.store(increment_index(rd_idx, to_read),
                      std::memory_order_release);

    return to_read;
  }